

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFGeneric<(moira::Instr)220,(moira::Mode)1,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  uVar3 = uVar3 & 0xffff;
  if ((uVar3 >> 0xe & 1) == 0) {
    cVar5 = 'f';
    lVar4 = 1;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar5;
      cVar5 = "facos"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar1);
    }
    StrWriter::operator<<(str,(Fp)(uVar3 >> 10 & 7));
  }
  else {
    cVar5 = 'f';
    lVar4 = 1;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar5;
      cVar5 = "facos"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    StrWriter::operator<<(str,(Ffmt)(uVar3 >> 10 & 7));
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar1);
    }
    StrWriter::operator<<(str,(An)(op & 7));
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Fp)(uVar3 >> 7 & 7));
  return;
}

Assistant:

void
Moira::dasmFGeneric(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer
                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{dst};
}